

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

bool slang::caseXWildcardEqual(SVInt *lhs,SVInt *rhs)

{
  uint uVar1;
  SVInt *pSVar2;
  SVInt *pSVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_28;
  uint local_20;
  byte local_1b;
  
  bVar4 = (lhs->super_SVIntStorage).unknownFlag;
  if ((bVar4 == false) && ((rhs->super_SVIntStorage).unknownFlag == false)) {
    bVar4 = exactlyEqual(lhs,rhs);
    return bVar4;
  }
  uVar9 = (lhs->super_SVIntStorage).bitWidth;
  uVar1 = (rhs->super_SVIntStorage).bitWidth;
  if (uVar9 == uVar1) {
    bVar10 = uVar1 + 0x3f < 0x40;
    if (!bVar10) {
      pSVar2 = (SVInt *)(lhs->super_SVIntStorage).field_0.val;
      bVar10 = (rhs->super_SVIntStorage).unknownFlag;
      if (bVar4 != false) {
        lhs = pSVar2;
      }
      pSVar3 = (SVInt *)(rhs->super_SVIntStorage).field_0.val;
      if (0x40 < uVar9) {
        lhs = pSVar2;
      }
      if (bVar10 != false) {
        rhs = pSVar3;
      }
      if (0x40 < uVar1) {
        rhs = pSVar3;
      }
      uVar9 = uVar1 + 0x3f >> 6;
      uVar5 = (ulong)(uVar9 << 3);
      lVar6 = 0;
      do {
        uVar8 = 0xffffffffffffffff;
        if (bVar4 != false) {
          uVar8 = ~*(ulong *)((long)&(pSVar2->super_SVIntStorage).field_0 + lVar6 * 8 + uVar5);
        }
        if (bVar10 != false) {
          uVar8 = uVar8 & ~*(ulong *)((long)&(pSVar3->super_SVIntStorage).field_0 +
                                     lVar6 * 8 + uVar5);
        }
        if ((((&(rhs->super_SVIntStorage).field_0)[lVar6].val ^
             (&(lhs->super_SVIntStorage).field_0)[lVar6].val) & uVar8) != 0) {
          return false;
        }
        lVar6 = lVar6 + 1;
      } while (uVar9 != (uint)lVar6);
      bVar10 = true;
    }
  }
  else {
    bVar7 = (rhs->super_SVIntStorage).signFlag & (lhs->super_SVIntStorage).signFlag;
    if (uVar9 < uVar1) {
      if (bVar7 == 0) {
        SVInt::zext((SVInt *)&local_28,(bitwidth_t)lhs);
      }
      else {
        SVInt::sext((SVInt *)&local_28,(bitwidth_t)lhs);
      }
      bVar10 = caseXWildcardEqual((SVInt *)&local_28,rhs);
    }
    else {
      if (bVar7 == 0) {
        SVInt::zext((SVInt *)&local_28,(bitwidth_t)rhs);
      }
      else {
        SVInt::sext((SVInt *)&local_28,(bitwidth_t)rhs);
      }
      bVar10 = caseXWildcardEqual(lhs,(SVInt *)&local_28);
    }
    if (((0x40 < local_20) || ((local_1b & 1) != 0)) && ((void *)local_28.val != (void *)0x0)) {
      operator_delete__(local_28.pVal);
    }
  }
  return bVar10;
}

Assistant:

bool caseXWildcardEqual(const SVInt& lhs, const SVInt& rhs) {
    // if no unknown flags, do normal comparison
    if (!lhs.unknownFlag && !rhs.unknownFlag)
        return exactlyEqual(lhs, rhs);

    // handle sign extension if necessary
    if (lhs.bitWidth != rhs.bitWidth) {
        bool bothSigned = lhs.signFlag && rhs.signFlag;
        if (lhs.bitWidth < rhs.bitWidth)
            return caseXWildcardEqual(lhs.extend(rhs.bitWidth, bothSigned), rhs);
        else
            return caseXWildcardEqual(lhs, rhs.extend(lhs.bitWidth, bothSigned));
    }

    uint32_t words = SVInt::getNumWords(rhs.bitWidth, false);
    for (uint32_t i = 0; i < words; ++i) {
        // bitmask to avoid comparing the unknown bits on either side
        uint64_t mask = UINT64_MAX;
        if (lhs.unknownFlag)
            mask &= ~lhs.pVal[i + words];
        if (rhs.unknownFlag)
            mask &= ~rhs.pVal[i + words];

        if ((lhs.getRawData()[i] & mask) != (rhs.getRawData()[i] & mask))
            return false;
    }

    return true;
}